

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall
testing::internal::FilePath::GenerateUniqueFileName
          (FilePath *this,FilePath *directory,FilePath *base_name,char *extension)

{
  int number_00;
  bool bVar1;
  size_t extraout_RDX;
  FilePath FVar2;
  FilePath local_40;
  int local_30;
  undefined1 local_29;
  int number;
  char *extension_local;
  FilePath *base_name_local;
  FilePath *directory_local;
  FilePath *full_pathname;
  
  local_29 = 0;
  _number = extension;
  extension_local = (char *)base_name;
  base_name_local = directory;
  directory_local = this;
  FilePath(this);
  local_30 = 0;
  do {
    number_00 = local_30;
    local_30 = local_30 + 1;
    MakeFileName(&local_40,base_name_local,(FilePath *)extension_local,number_00,_number);
    Set(this,&local_40);
    ~FilePath(&local_40);
    bVar1 = FileOrDirectoryExists(this);
  } while (bVar1);
  FVar2.pathname_.length_ = extraout_RDX;
  FVar2.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::GenerateUniqueFileName(const FilePath& directory,
                                          const FilePath& base_name,
                                          const char* extension) {
  FilePath full_pathname;
  int number = 0;
  do {
    full_pathname.Set(MakeFileName(directory, base_name, number++, extension));
  } while (full_pathname.FileOrDirectoryExists());
  return full_pathname;
}